

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool pugi::impl::anon_unknown_0::xpath_ast_node::
     compare_rel<pugi::impl::(anonymous_namespace)::less>
               (xpath_ast_node *lhs,xpath_ast_node *rhs,xpath_context *c,xpath_stack *stack,
               less *comp)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  xpath_allocator *pxVar4;
  xpath_memory_block *pxVar5;
  size_t sVar6;
  xpath_allocator *alloc;
  xpath_memory_block *pxVar7;
  size_t sVar8;
  xpath_memory_block *pxVar9;
  xpath_node *pxVar10;
  xpath_memory_block *pxVar11;
  xpath_node *na;
  xpath_allocator *pxVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  xpath_node_set_raw rs;
  xpath_node_set_raw ls;
  size_t local_b8;
  char_t *local_88;
  xpath_node *local_80;
  xpath_node *local_78;
  xpath_node_set_raw local_68;
  xpath_string local_48;
  
  cVar1 = lhs->_rettype;
  cVar2 = rhs->_rettype;
  if (cVar2 == '\x01' || cVar1 == '\x01') {
    if (cVar2 == '\x01' && cVar1 == '\x01') {
      pxVar12 = stack->result;
      pxVar11 = pxVar12->_root;
      sVar3 = pxVar12->_root_size;
      eval_node_set(&local_68,lhs,c,stack,nodeset_eval_all);
      eval_node_set((xpath_node_set_raw *)&local_88,rhs,c,stack,nodeset_eval_all);
      bVar13 = local_68._begin != local_68._end;
      if (bVar13) {
        bVar13 = true;
        pxVar10 = local_68._begin;
        do {
          pxVar4 = stack->result;
          pxVar5 = pxVar4->_root;
          sVar6 = pxVar4->_root_size;
          string_value(&local_48,pxVar10,pxVar4);
          dVar14 = convert_string_to_number(local_48._buffer);
          na = local_80;
          if (local_80 != local_78) {
LAB_0038c943:
            alloc = stack->result;
            pxVar7 = alloc->_root;
            sVar8 = alloc->_root_size;
            string_value(&local_48,na,alloc);
            dVar15 = convert_string_to_number(local_48._buffer);
            pxVar9 = alloc->_root;
            while (pxVar9 != pxVar7) {
              pxVar9 = pxVar9->next;
              (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                        deallocate)();
            }
            alloc->_root = pxVar7;
            alloc->_root_size = sVar8;
            if (dVar15 <= dVar14) goto code_r0x0038c9ab;
            pxVar7 = pxVar4->_root;
            while (pxVar7 != pxVar5) {
              pxVar7 = pxVar7->next;
              (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                        deallocate)();
            }
            pxVar4->_root = pxVar5;
            pxVar4->_root_size = sVar6;
            break;
          }
LAB_0038c9bb:
          pxVar7 = pxVar4->_root;
          while (pxVar7 != pxVar5) {
            pxVar7 = pxVar7->next;
            (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
            )();
          }
          pxVar4->_root = pxVar5;
          pxVar4->_root_size = sVar6;
          pxVar10 = pxVar10 + 1;
          bVar13 = pxVar10 != local_68._end;
        } while (bVar13);
      }
      pxVar5 = pxVar12->_root;
      while (pxVar5 != pxVar11) {
        pxVar5 = pxVar5->next;
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
      }
      pxVar12->_root = pxVar11;
      pxVar12->_root_size = sVar3;
    }
    else {
      if (cVar1 == '\x01' || cVar2 != '\x01') {
        if ((cVar1 != '\x01') || (cVar2 == '\x01')) {
          __assert_fail("false && \"Wrong types\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                        ,0x26a5,
                        "static bool pugi::impl::(anonymous namespace)::xpath_ast_node::compare_rel(xpath_ast_node *, xpath_ast_node *, const xpath_context &, const xpath_stack &, const Comp &) [Comp = pugi::impl::(anonymous namespace)::less]"
                       );
        }
        pxVar12 = stack->result;
        pxVar11 = pxVar12->_root;
        local_b8 = pxVar12->_root_size;
        eval_node_set(&local_68,lhs,c,stack,nodeset_eval_all);
        dVar14 = eval_number(rhs,c,stack);
        bVar13 = local_68._begin == local_68._end;
        pxVar10 = local_68._begin;
        while (!bVar13) {
          pxVar4 = stack->result;
          pxVar5 = pxVar4->_root;
          sVar3 = pxVar4->_root_size;
          string_value((xpath_string *)&local_88,pxVar10,pxVar4);
          dVar15 = convert_string_to_number(local_88);
          pxVar7 = pxVar4->_root;
          while (pxVar7 != pxVar5) {
            pxVar7 = pxVar7->next;
            (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
            )();
          }
          pxVar4->_root = pxVar5;
          pxVar4->_root_size = sVar3;
          if (dVar15 < dVar14) break;
          pxVar10 = pxVar10 + 1;
          bVar13 = pxVar10 == local_68._end;
        }
        pxVar5 = pxVar12->_root;
        while (pxVar5 != pxVar11) {
          pxVar5 = pxVar5->next;
          (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                    ();
        }
      }
      else {
        pxVar12 = stack->result;
        pxVar11 = pxVar12->_root;
        local_b8 = pxVar12->_root_size;
        dVar14 = eval_number(lhs,c,stack);
        eval_node_set(&local_68,rhs,c,stack,nodeset_eval_all);
        bVar13 = local_68._begin == local_68._end;
        pxVar10 = local_68._begin;
        while (!bVar13) {
          pxVar4 = stack->result;
          pxVar5 = pxVar4->_root;
          sVar3 = pxVar4->_root_size;
          string_value((xpath_string *)&local_88,pxVar10,pxVar4);
          dVar15 = convert_string_to_number(local_88);
          pxVar7 = pxVar4->_root;
          while (pxVar7 != pxVar5) {
            pxVar7 = pxVar7->next;
            (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
            )();
          }
          pxVar4->_root = pxVar5;
          pxVar4->_root_size = sVar3;
          if (dVar14 < dVar15) break;
          pxVar10 = pxVar10 + 1;
          bVar13 = pxVar10 == local_68._end;
        }
        pxVar5 = pxVar12->_root;
        while (pxVar5 != pxVar11) {
          pxVar5 = pxVar5->next;
          (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                    ();
        }
      }
      bVar13 = !bVar13;
      pxVar12->_root = pxVar11;
      pxVar12->_root_size = local_b8;
    }
  }
  else {
    dVar14 = eval_number(lhs,c,stack);
    dVar15 = eval_number(rhs,c,stack);
    bVar13 = dVar14 < dVar15;
  }
  return bVar13;
code_r0x0038c9ab:
  na = na + 1;
  if (na == local_78) goto LAB_0038c9bb;
  goto LAB_0038c943;
}

Assistant:

static bool compare_rel(xpath_ast_node* lhs, xpath_ast_node* rhs, const xpath_context& c, const xpath_stack& stack, const Comp& comp)
		{
			xpath_value_type lt = lhs->rettype(), rt = rhs->rettype();

			if (lt != xpath_type_node_set && rt != xpath_type_node_set)
				return comp(lhs->eval_number(c, stack), rhs->eval_number(c, stack));
			else if (lt == xpath_type_node_set && rt == xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ls = lhs->eval_node_set(c, stack, nodeset_eval_all);
				xpath_node_set_raw rs = rhs->eval_node_set(c, stack, nodeset_eval_all);

				for (const xpath_node* li = ls.begin(); li != ls.end(); ++li)
				{
					xpath_allocator_capture cri(stack.result);

					double l = convert_string_to_number(string_value(*li, stack.result).c_str());

					for (const xpath_node* ri = rs.begin(); ri != rs.end(); ++ri)
					{
						xpath_allocator_capture crii(stack.result);

						if (comp(l, convert_string_to_number(string_value(*ri, stack.result).c_str())))
							return true;
					}
				}

				return false;
			}
			else if (lt != xpath_type_node_set && rt == xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				double l = lhs->eval_number(c, stack);
				xpath_node_set_raw rs = rhs->eval_node_set(c, stack, nodeset_eval_all);

				for (const xpath_node* ri = rs.begin(); ri != rs.end(); ++ri)
				{
					xpath_allocator_capture cri(stack.result);

					if (comp(l, convert_string_to_number(string_value(*ri, stack.result).c_str())))
						return true;
				}

				return false;
			}
			else if (lt == xpath_type_node_set && rt != xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ls = lhs->eval_node_set(c, stack, nodeset_eval_all);
				double r = rhs->eval_number(c, stack);

				for (const xpath_node* li = ls.begin(); li != ls.end(); ++li)
				{
					xpath_allocator_capture cri(stack.result);

					if (comp(convert_string_to_number(string_value(*li, stack.result).c_str()), r))
						return true;
				}

				return false;
			}
			else
			{
				assert(false && "Wrong types"); // unreachable
				return false;
			}
		}